

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt5a.cpp
# Opt level: O2

void __thiscall
crnlib::dxt5_endpoint_optimizer::dxt5_endpoint_optimizer(dxt5_endpoint_optimizer *this)

{
  (this->m_best_selectors).m_p = (uchar *)0x0;
  (this->m_best_selectors).m_size = 0;
  (this->m_best_selectors).m_capacity = 0;
  (this->m_trial_selectors).m_p = (uchar *)0x0;
  (this->m_trial_selectors).m_size = 0;
  (this->m_trial_selectors).m_capacity = 0;
  (this->m_unique_value_weights).m_p = (uint *)0x0;
  (this->m_unique_value_weights).m_size = 0;
  (this->m_unique_value_weights).m_capacity = 0;
  (this->m_unique_values).m_p = (uchar *)0x0;
  (this->m_unique_values).m_size = 0;
  (this->m_unique_values).m_capacity = 0;
  this->m_pParams = (params *)0x0;
  this->m_pResults = (results *)0x0;
  sparse_bit_array::sparse_bit_array(&this->m_flags);
  vector<unsigned_char>::reserve(&this->m_unique_values,0x10);
  vector<unsigned_int>::reserve(&this->m_unique_value_weights,0x10);
  return;
}

Assistant:

dxt5_endpoint_optimizer::dxt5_endpoint_optimizer() :
        m_pParams(nullptr),
        m_pResults(nullptr)
    {
        m_unique_values.reserve(16);
        m_unique_value_weights.reserve(16);
    }